

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  char cVar7;
  Index size;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  string *psVar14;
  ostream *poVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  _Rb_tree_header *p_Var19;
  ostringstream errorMsg;
  long *local_1e0;
  long local_1d0 [2];
  MatrixDynSize *local_1c0;
  _Base_ptr local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar8 = iDynTree::MatrixDynSize::rows();
  lVar9 = iDynTree::VectorDynSize::size();
  if (lVar8 == lVar9) {
    lVar8 = iDynTree::MatrixDynSize::cols();
    lVar9 = iDynTree::VectorDynSize::size();
    if (lVar8 == lVar9) goto LAB_00147006;
  }
  uVar10 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)partialDerivative,uVar10);
LAB_00147006:
  p_Var13 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var19 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var13 != p_Var19) {
    bVar18 = true;
    local_1c0 = partialDerivative;
    do {
      bVar6 = TimeRange::isInRange((TimeRange *)&p_Var13[8]._M_left,time);
      if (bVar6) {
        cVar7 = (**(code **)(**(long **)(p_Var13 + 2) + 0x38))
                          (time,*(long **)(p_Var13 + 2),state,control,p_Var13 + 5);
        if (cVar7 == '\0') {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating cost ",0x1c);
          psVar14 = Cost::name_abi_cxx11_(*(Cost **)(p_Var13 + 2));
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar14->_M_dataplus)._M_p,
                               psVar14->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",
                     (char *)local_1e0);
          goto LAB_00147394;
        }
        lVar8 = iDynTree::MatrixDynSize::rows();
        lVar9 = iDynTree::VectorDynSize::size();
        if (lVar8 == lVar9) {
          lVar8 = iDynTree::MatrixDynSize::cols();
          lVar9 = iDynTree::VectorDynSize::size();
          if (lVar8 == lVar9) {
            lVar8 = iDynTree::MatrixDynSize::data();
            iDynTree::MatrixDynSize::rows();
            iDynTree::MatrixDynSize::cols();
            local_1b8 = p_Var13[8]._M_parent;
            uStack_1b0 = 0;
            uVar10 = iDynTree::MatrixDynSize::data();
            lVar9 = iDynTree::MatrixDynSize::rows();
            lVar11 = iDynTree::MatrixDynSize::cols();
            uVar12 = lVar11 * lVar9;
            if (bVar18) {
              uVar16 = uVar12;
              if (((uVar10 & 7) == 0) &&
                 (uVar16 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar12 <= (long)uVar16)) {
                uVar16 = uVar12;
              }
              if (0 < (long)uVar16) {
                uVar17 = 0;
                do {
                  *(double *)(uVar10 + uVar17 * 8) =
                       *(double *)(lVar8 + uVar17 * 8) * (double)local_1b8;
                  uVar17 = uVar17 + 1;
                } while (uVar16 != uVar17);
              }
              lVar11 = uVar12 - uVar16;
              lVar9 = (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
              if (1 < lVar11) {
                do {
                  pdVar1 = (double *)(lVar8 + uVar16 * 8);
                  dVar4 = pdVar1[1];
                  pdVar2 = (double *)(uVar10 + uVar16 * 8);
                  *pdVar2 = *pdVar1 * (double)local_1b8;
                  pdVar2[1] = dVar4 * (double)local_1b8;
                  uVar16 = uVar16 + 2;
                } while ((long)uVar16 < lVar9);
              }
              if (lVar9 < (long)uVar12) {
                do {
                  *(double *)(uVar10 + lVar9 * 8) =
                       *(double *)(lVar8 + lVar9 * 8) * (double)local_1b8;
                  lVar9 = lVar9 + 1;
                } while (uVar12 - lVar9 != 0);
              }
            }
            else {
              uVar16 = uVar12;
              if (((uVar10 & 7) == 0) &&
                 (uVar16 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar12 <= (long)uVar16)) {
                uVar16 = uVar12;
              }
              if (0 < (long)uVar16) {
                uVar17 = 0;
                do {
                  *(double *)(uVar10 + uVar17 * 8) =
                       *(double *)(lVar8 + uVar17 * 8) * (double)local_1b8 +
                       *(double *)(uVar10 + uVar17 * 8);
                  uVar17 = uVar17 + 1;
                } while (uVar16 != uVar17);
              }
              lVar11 = uVar12 - uVar16;
              lVar9 = (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
              if (1 < lVar11) {
                do {
                  pdVar1 = (double *)(lVar8 + uVar16 * 8);
                  dVar5 = pdVar1[1];
                  pdVar2 = (double *)(uVar10 + uVar16 * 8);
                  dVar4 = pdVar2[1];
                  pdVar3 = (double *)(uVar10 + uVar16 * 8);
                  *pdVar3 = *pdVar1 * (double)local_1b8 + *pdVar2;
                  pdVar3[1] = dVar5 * (double)local_1b8 + dVar4;
                  uVar16 = uVar16 + 2;
                } while ((long)uVar16 < lVar9);
              }
              if (lVar9 < (long)uVar12) {
                do {
                  *(double *)(uVar10 + lVar9 * 8) =
                       *(double *)(lVar8 + lVar9 * 8) * (double)local_1b8 +
                       *(double *)(uVar10 + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (uVar12 - lVar9 != 0);
              }
            }
            bVar18 = false;
            goto LAB_00147272;
          }
        }
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error while evaluating ",0x17);
        psVar14 = Cost::name_abi_cxx11_(*(Cost **)(p_Var13 + 2));
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar14->_M_dataplus)._M_p,
                             psVar14->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,
                   "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension."
                   ,0x80);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",
                   (char *)local_1e0);
LAB_00147394:
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
LAB_00147272:
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var19);
  }
  return true;
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &partialDerivative)
        {
            if ((partialDerivative.rows() != state.size()) || (partialDerivative.cols() != control.size())) {
                partialDerivative.resize(state.size(), control.size());
            }

            bool first = true;

            for (auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){

                    if (!cost.second.cost->costSecondPartialDerivativeWRTStateControl(time, state, control, cost.second.mixedHessianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if ((cost.second.mixedHessianBuffer.rows() != state.size()) || (cost.second.mixedHessianBuffer.cols() != control.size())){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension.";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                    }
                }
            }
            return true;
        }